

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O2

Tensor * __thiscall
cnn::SimpleExecutionEngine::forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  int iVar1;
  undefined4 extraout_var;
  
  (*(this->super_ExecutionEngine)._vptr_ExecutionEngine[2])();
  iVar1 = (*(this->super_ExecutionEngine)._vptr_ExecutionEngine[6])(this);
  return (Tensor *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const Tensor& SimpleExecutionEngine::forward(VariableIndex i) {
  invalidate();
  return incremental_forward(i);
}